

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

MODSTRUCT * LOADAllocModule(void *dl_handle,LPCSTR name)

{
  int *piVar1;
  LPWSTR pWVar2;
  LPWSTR wide_name;
  MODSTRUCT *module;
  LPCSTR name_local;
  void *dl_handle_local;
  
  dl_handle_local = CorUnix::InternalMalloc(0x40);
  if (dl_handle_local == (void *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar1 = __errno_location();
    strerror(*piVar1);
    dl_handle_local = (void *)0x0;
  }
  else {
    pWVar2 = UTIL_MBToWC_Alloc(name,-1);
    if (pWVar2 == (LPWSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CorUnix::InternalFree(dl_handle_local);
      dl_handle_local = (void *)0x0;
    }
    else {
      *(void **)((long)dl_handle_local + 8) = dl_handle;
      *(undefined4 *)((long)dl_handle_local + 0x20) = 1;
      *(void **)dl_handle_local = dl_handle_local;
      *(undefined8 *)((long)dl_handle_local + 0x10) = 0;
      *(undefined4 *)((long)dl_handle_local + 0x24) = 1;
      *(undefined8 *)((long)dl_handle_local + 0x28) = 0;
      *(undefined8 *)((long)dl_handle_local + 0x30) = 0;
      *(undefined8 *)((long)dl_handle_local + 0x38) = 0;
      *(LPWSTR *)((long)dl_handle_local + 0x18) = pWVar2;
    }
  }
  return (MODSTRUCT *)dl_handle_local;
}

Assistant:

static MODSTRUCT *LOADAllocModule(void *dl_handle, LPCSTR name)
{
    MODSTRUCT *module;
    LPWSTR wide_name;

    /* no match found : try to create a new module structure */
    module = (MODSTRUCT *)InternalMalloc(sizeof(MODSTRUCT));
    if (nullptr == module)
    {
        ERROR("malloc() failed! errno is %d (%s)\n", errno, strerror(errno));
        return nullptr;
    }

    wide_name = UTIL_MBToWC_Alloc(name, -1);
    if (nullptr == wide_name)
    {
        ERROR("couldn't convert name to a wide-character string\n");
        InternalFree(module);
        return nullptr;
    }

    module->dl_handle = dl_handle;
#if NEED_DLCOMPAT
    if (isdylib(module))
    {
        module->refcount = -1;
    }
    else
    {
        module->refcount = 1;
    }
#else   // NEED_DLCOMPAT
    module->refcount = 1;
#endif  // NEED_DLCOMPAT
    module->self = module;
    module->hinstance = nullptr;
    module->threadLibCalls = TRUE;
    module->pDllMain = nullptr;
    module->next = nullptr;
    module->prev = nullptr;

    module->lib_name = wide_name;

    return module;
}